

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif.cpp
# Opt level: O0

void __thiscall
Potassco::AspifOutput::rule
          (AspifOutput *this,Head_t ht,AtomSpan *head,Weight_t bound,WeightLitSpan *body)

{
  undefined4 in_ECX;
  WeightLitSpan *in_RDX;
  AspifOutput *in_RDI;
  AtomSpan *in_R8;
  int in_stack_ffffffffffffffbc;
  AspifOutput *in_stack_ffffffffffffffc8;
  Directive_t in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  AspifOutput *this_00;
  Head_t local_4;
  
  this_00 = in_RDI;
  Directive_t::Directive_t((Directive_t *)&stack0xffffffffffffffd4,Rule);
  startDir(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd4);
  Head_t::operator_cast_to_unsigned_int(&local_4);
  add(in_RDI,in_stack_ffffffffffffffbc);
  add((AspifOutput *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_R8);
  add(in_RDI,in_stack_ffffffffffffffbc);
  add(in_RDI,in_stack_ffffffffffffffbc);
  add(this_00,in_RDX);
  endDir(in_RDI);
  return;
}

Assistant:

void AspifOutput::rule(Head_t ht, const AtomSpan& head, Weight_t bound, const WeightLitSpan& body) {
	startDir(Directive_t::Rule).add(static_cast<int>(ht)).add(head)
		.add(static_cast<int>(Body_t::Sum)).add(static_cast<int>(bound)).add(body)
		.endDir();
}